

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pp_etc.c
# Opt level: O1

bool_t ppIsIrred(word *a,size_t n,void *stack)

{
  word *d;
  int iVar1;
  bool_t bVar2;
  size_t n_00;
  size_t sVar3;
  ulong uVar4;
  
  n_00 = wwWordSize(a,n);
  iVar1 = wwCmpW(a,n_00,1);
  bVar2 = 0;
  if (0 < iVar1) {
    wwSetW((word *)stack,n_00,4);
    sVar3 = wwBitSize(a,n_00);
    if (1 < sVar3 - 1) {
      d = (word *)((long)stack + n * 8);
      uVar4 = sVar3 - 1 >> 1;
      do {
        wwFlipBit((word *)stack,1);
        bVar2 = wwIsZero((word *)stack,n_00);
        if (bVar2 != 0) {
          return 0;
        }
        ppGCD(d,(word *)stack,n_00,a,n_00,d + n);
        iVar1 = wwCmpW(d,n_00,1);
        if (iVar1 != 0) {
          return 0;
        }
        wwFlipBit((word *)stack,1);
        if (uVar4 != 1) {
          ppSqrMod((word *)stack,(word *)stack,a,n_00,d + n);
        }
        uVar4 = uVar4 - 1;
      } while (uVar4 != 0);
    }
    bVar2 = 1;
  }
  return bVar2;
}

Assistant:

bool_t ppIsIrred(const word a[], size_t n, void* stack)
{
	size_t i;
	word* h = (word*)stack;
	word* d = h + n;
	stack = d + n;
	// нормализация (нужна для \mod a)
	n = wwWordSize(a, n);
	// постоянный многочлен не является неприводимым
	if (wwCmpW(a, n, 1) <= 0)
		return FALSE;
	// h <- x^2
	wwSetW(h, n, 4);
	// основной цикл
	for (i = ppDeg(a, n) / 2; i; --i)
	{
		// (h + x, a) == 1?
		wwFlipBit(h, 1);
		if (wwIsZero(h, n))
			return FALSE;
		ppGCD(d, h, n, a, n, stack);
		if (wwCmpW(d, n, 1) != 0)
			return FALSE;
		wwFlipBit(h, 1);
		// h <- h^2 \mod a
		if (i > 1)
			ppSqrMod(h, h, a, n, stack);
	}
	return TRUE;
}